

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O3

void __thiscall xmrig::HttpClient::handshake(HttpClient *this)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ulong __val;
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  HttpClient *pHVar4;
  char cVar5;
  char *__s;
  size_t sVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  char cVar10;
  string __str;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1c8;
  HttpClient *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [5];
  ios_base local_138 [264];
  
  this_00 = &(this->super_HttpContext).super_HttpData.headers;
  local_1e8._M_dataplus._M_p = (this->m_dns->m_host).m_data;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_*,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8,(char (*) [5])"Host",(char **)&local_1e8);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8);
  paVar2 = &(((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b8)->second).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != paVar2) {
    operator_delete(local_198._M_p);
  }
  poVar3 = (ostream *)
           &(((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b8)->first).field_2;
  if ((ostream *)local_1b8._0_8_ != poVar3) {
    operator_delete((void *)local_1b8._0_8_);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8,(char (*) [11])"Connection",(char (*) [6])"close");
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != paVar2) {
    operator_delete(local_198._M_p);
  }
  if ((ostream *)local_1b8._0_8_ != poVar3) {
    operator_delete((void *)local_1b8._0_8_);
  }
  local_1e8._M_dataplus._M_p = (pointer)Platform::m_userAgent;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_*,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8,(char (*) [11])"User-Agent",(char **)&local_1e8);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != paVar2) {
    operator_delete(local_198._M_p);
  }
  if ((ostream *)local_1b8._0_8_ != poVar3) {
    operator_delete((void *)local_1b8._0_8_);
  }
  __val = (this->super_HttpContext).super_HttpData.body._M_string_length;
  if (__val != 0) {
    cVar10 = '\x01';
    if (9 < __val) {
      uVar9 = __val;
      cVar5 = '\x04';
      do {
        cVar10 = cVar5;
        if (uVar9 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00152aa2;
        }
        if (uVar9 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00152aa2;
        }
        if (uVar9 < 10000) goto LAB_00152aa2;
        bVar1 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar5 = cVar10 + '\x04';
      } while (bVar1);
      cVar10 = cVar10 + '\x01';
    }
LAB_00152aa2:
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1e8._M_dataplus._M_p,(uint)local_1e8._M_string_length,__val);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8,(char (*) [15])"Content-Length",&local_1e8);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
                *)this_00,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != paVar2) {
      operator_delete(local_198._M_p);
    }
    if ((ostream *)local_1b8._0_8_ != poVar3) {
      operator_delete((void *)local_1b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  __s = http_method_str((this->super_HttpContext).super_HttpData.method);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18));
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(this->super_HttpContext).super_HttpData.url._M_dataplus._M_p,
                      (this->super_HttpContext).super_HttpData.url._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," HTTP/1.1",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\r\n",2);
  local_1c8 = this_00;
  local_1c0 = this;
  for (p_Var8 = (this->super_HttpContext).super_HttpData.headers._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->super_HttpContext).super_HttpData.headers._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\r\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  pHVar4 = local_1c0;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&local_1c8->_M_t);
  std::__cxx11::stringbuf::str();
  (*(pHVar4->super_HttpContext)._vptr_HttpContext[5])(pHVar4,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void xmrig::HttpClient::handshake()
{
    headers.insert({ "Host",       m_dns->host().data() });
    headers.insert({ "Connection", "close" });
    headers.insert({ "User-Agent", Platform::userAgent() });

    if (!body.empty()) {
        headers.insert({ "Content-Length", std::to_string(body.size()) });
    }

    std::stringstream ss;
    ss << http_method_str(static_cast<http_method>(method)) << " " << url << " HTTP/1.1" << kCRLF;

    for (auto &header : headers) {
        ss << header.first << ": " << header.second << kCRLF;
    }

    ss << kCRLF;

    headers.clear();

    write(ss.str());
}